

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O0

ON_wString __thiscall
ON_wString::FromSecondsSinceJanuaryFirst1970
          (ON_wString *this,ON__UINT64 seconds_since_jan_first_1970,ON_DateFormat date_format,
          ON_TimeFormat time_format,wchar_t date_separator,wchar_t date_time_separator,
          wchar_t time_separator)

{
  tm *__src;
  tm *t;
  time_t uct;
  tm current_time;
  wchar_t date_time_separator_local;
  wchar_t date_separator_local;
  ON_TimeFormat time_format_local;
  ON_DateFormat date_format_local;
  ON__UINT64 seconds_since_jan_first_1970_local;
  
  current_time.tm_zone._0_4_ = date_time_separator;
  current_time.tm_zone._4_4_ = date_separator;
  memset(&uct,0,0x38);
  t = (tm *)seconds_since_jan_first_1970;
  __src = gmtime((time_t *)&t);
  if (__src != (tm *)0x0) {
    memcpy(&uct,__src,0x38);
  }
  FromTime(this,(tm *)&uct,date_format,time_format,current_time.tm_zone._4_4_,
           (wchar_t)current_time.tm_zone,time_separator);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::FromSecondsSinceJanuaryFirst1970(
  ON__UINT64 seconds_since_jan_first_1970,
  ON_DateFormat date_format,
  ON_TimeFormat time_format,
  wchar_t date_separator,
  wchar_t date_time_separator,
  wchar_t time_separator
)
{
  struct tm current_time;
  memset(&current_time, 0, sizeof(current_time));
  time_t uct = (time_t)seconds_since_jan_first_1970;
  const struct tm* t = gmtime(&uct);
  if (t)
  {
    current_time = *t;
  }  
  return FromTime(current_time, date_format, time_format, date_separator, date_time_separator, time_separator);
}